

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

GLuint LoadShaders(char *vertex_file_path,char *fragment_file_path)

{
  char cVar1;
  GLuint GVar2;
  GLuint GVar3;
  istream *piVar4;
  int InfoLogLength;
  GLint Result;
  string Line_1;
  string FragmentShaderCode;
  char *VertexSourcePointer;
  string VertexShaderCode;
  char *FragmentSourcePointer;
  ifstream FragmentShaderStream;
  ifstream VertexShaderStream;
  uint local_4ec;
  allocator_type local_4e5;
  GLuint local_4e4;
  GLuint local_4e0;
  GLint local_4dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  char *local_498;
  char *local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  char *local_468;
  undefined8 local_460;
  char local_458;
  undefined7 uStack_457;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [16];
  long local_238 [65];
  
  local_498 = fragment_file_path;
  GVar2 = (*__glewCreateShader)(0x8b31);
  GVar3 = (*__glewCreateShader)(0x8b30);
  local_468 = &local_458;
  local_460 = 0;
  local_458 = '\0';
  local_490 = vertex_file_path;
  std::ifstream::ifstream((istream *)local_238,vertex_file_path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    GVar2 = 0;
    printf("Impossible to open %s. Are you in the right directory ? Don\'t forget to read the FAQ !\n"
           ,local_490);
    getchar();
  }
  else {
    local_4e4 = GVar2;
    local_4e0 = GVar3;
    local_440[0]._M_dataplus._M_p = (pointer)&local_440[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"");
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)local_440,cVar1);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&local_4b8,"\n",local_440);
      std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_4b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,
                        CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                                 local_4b8.field_2._M_local_buf[0]) + 1);
      }
    }
    std::ifstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440[0]._M_dataplus._M_p != &local_440[0].field_2) {
      operator_delete(local_440[0]._M_dataplus._M_p,local_440[0].field_2._M_allocated_capacity + 1);
    }
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    local_4b8._M_string_length = 0;
    local_4b8.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(local_440,local_498,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
      while( true ) {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_440[0]._M_dataplus._M_p + -0x18) +
                                (char)local_440);
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_440,(string *)&local_4d8,cVar1);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        std::operator+(&local_488,"\n",&local_4d8);
        std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_488._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
      }
      std::ifstream::close();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
    }
    local_4dc = 0;
    printf("Compiling shader : %s\n",local_490);
    GVar2 = local_4e4;
    local_488._M_dataplus._M_p = local_468;
    (*__glewShaderSource)(local_4e4,1,(GLchar **)&local_488,(GLint *)0x0);
    (*__glewCompileShader)(GVar2);
    (*__glewGetShaderiv)(GVar2,0x8b81,&local_4dc);
    (*__glewGetShaderiv)(GVar2,0x8b84,(GLint *)&local_4ec);
    if (0 < (int)local_4ec) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_4d8,(ulong)local_4ec + 1,
                 (allocator_type *)&local_448);
      (*__glewGetShaderInfoLog)(local_4e4,local_4ec,(GLsizei *)0x0,local_4d8._M_dataplus._M_p);
      puts(local_4d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_4d8._M_dataplus._M_p,
                        local_4d8.field_2._M_allocated_capacity - (long)local_4d8._M_dataplus._M_p);
      }
    }
    printf("Compiling shader : %s\n",local_498);
    GVar2 = local_4e0;
    local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8._M_dataplus._M_p;
    (*__glewShaderSource)(local_4e0,1,(GLchar **)&local_448,(GLint *)0x0);
    (*__glewCompileShader)(GVar2);
    (*__glewGetShaderiv)(GVar2,0x8b81,&local_4dc);
    (*__glewGetShaderiv)(GVar2,0x8b84,(GLint *)&local_4ec);
    if (0 < (int)local_4ec) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_4d8,(ulong)local_4ec + 1,&local_4e5);
      (*__glewGetShaderInfoLog)(GVar2,local_4ec,(GLsizei *)0x0,local_4d8._M_dataplus._M_p);
      puts(local_4d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_4d8._M_dataplus._M_p,
                        local_4d8.field_2._M_allocated_capacity - (long)local_4d8._M_dataplus._M_p);
      }
    }
    puts("Linking program");
    GVar2 = (*__glewCreateProgram)();
    (*__glewAttachShader)(GVar2,local_4e4);
    (*__glewAttachShader)(GVar2,local_4e0);
    (*__glewLinkProgram)(GVar2);
    (*__glewGetProgramiv)(GVar2,0x8b82,&local_4dc);
    (*__glewGetProgramiv)(GVar2,0x8b84,(GLint *)&local_4ec);
    if (0 < (int)local_4ec) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_4d8,(ulong)local_4ec + 1,&local_4e5);
      (*__glewGetProgramInfoLog)(GVar2,local_4ec,(GLsizei *)0x0,local_4d8._M_dataplus._M_p);
      puts(local_4d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_4d8._M_dataplus._M_p,
                        local_4d8.field_2._M_allocated_capacity - (long)local_4d8._M_dataplus._M_p);
      }
    }
    (*__glewDetachShader)(GVar2,local_4e4);
    (*__glewDetachShader)(GVar2,local_4e0);
    (*__glewDeleteShader)(local_4e4);
    (*__glewDeleteShader)(local_4e0);
    std::ifstream::~ifstream(local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,
                      CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                               local_4b8.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  if (local_468 != &local_458) {
    operator_delete(local_468,CONCAT71(uStack_457,local_458) + 1);
  }
  return GVar2;
}

Assistant:

GLuint LoadShaders(const char * vertex_file_path,const char * fragment_file_path){

	// Create the shaders
	GLuint VertexShaderID = glCreateShader(GL_VERTEX_SHADER);
	GLuint FragmentShaderID = glCreateShader(GL_FRAGMENT_SHADER);

	// Read the Vertex Shader code from the file
	std::string VertexShaderCode;
	std::ifstream VertexShaderStream(vertex_file_path, std::ios::in);
	if(VertexShaderStream.is_open()){
		std::string Line = "";
		while(getline(VertexShaderStream, Line))
			VertexShaderCode += "\n" + Line;
		VertexShaderStream.close();
	}else{
		printf("Impossible to open %s. Are you in the right directory ? Don't forget to read the FAQ !\n", vertex_file_path);
		getchar();
		return 0;
	}

	// Read the Fragment Shader code from the file
	std::string FragmentShaderCode;
	std::ifstream FragmentShaderStream(fragment_file_path, std::ios::in);
	if(FragmentShaderStream.is_open()){
		std::string Line = "";
		while(getline(FragmentShaderStream, Line))
			FragmentShaderCode += "\n" + Line;
		FragmentShaderStream.close();
	}

	GLint Result = GL_FALSE;
	int InfoLogLength;


	// Compile Vertex Shader
	printf("Compiling shader : %s\n", vertex_file_path);
	char const * VertexSourcePointer = VertexShaderCode.c_str();
	glShaderSource(VertexShaderID, 1, &VertexSourcePointer , NULL);
	glCompileShader(VertexShaderID);

	// Check Vertex Shader
	glGetShaderiv(VertexShaderID, GL_COMPILE_STATUS, &Result);
	glGetShaderiv(VertexShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> VertexShaderErrorMessage(InfoLogLength+1);
		glGetShaderInfoLog(VertexShaderID, InfoLogLength, NULL, &VertexShaderErrorMessage[0]);
		printf("%s\n", &VertexShaderErrorMessage[0]);
	}



	// Compile Fragment Shader
	printf("Compiling shader : %s\n", fragment_file_path);
	char const * FragmentSourcePointer = FragmentShaderCode.c_str();
	glShaderSource(FragmentShaderID, 1, &FragmentSourcePointer , NULL);
	glCompileShader(FragmentShaderID);

	// Check Fragment Shader
	glGetShaderiv(FragmentShaderID, GL_COMPILE_STATUS, &Result);
	glGetShaderiv(FragmentShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> FragmentShaderErrorMessage(InfoLogLength+1);
		glGetShaderInfoLog(FragmentShaderID, InfoLogLength, NULL, &FragmentShaderErrorMessage[0]);
		printf("%s\n", &FragmentShaderErrorMessage[0]);
	}



	// Link the program
	printf("Linking program\n");
	GLuint ProgramID = glCreateProgram();
	glAttachShader(ProgramID, VertexShaderID);
	glAttachShader(ProgramID, FragmentShaderID);
	glLinkProgram(ProgramID);

	// Check the program
	glGetProgramiv(ProgramID, GL_LINK_STATUS, &Result);
	glGetProgramiv(ProgramID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> ProgramErrorMessage(InfoLogLength+1);
		glGetProgramInfoLog(ProgramID, InfoLogLength, NULL, &ProgramErrorMessage[0]);
		printf("%s\n", &ProgramErrorMessage[0]);
	}

	
	glDetachShader(ProgramID, VertexShaderID);
	glDetachShader(ProgramID, FragmentShaderID);
	
	glDeleteShader(VertexShaderID);
	glDeleteShader(FragmentShaderID);

	return ProgramID;
}